

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledOutputFile::DeepTiledOutputFile
          (DeepTiledOutputFile *this,char *fileName,Header *header,int numThreads)

{
  void *pvVar1;
  undefined8 uVar2;
  Int64 IVar3;
  OStream *in_RDI;
  undefined1 unaff_retaddr;
  OStream *in_stack_00000008;
  Header *in_stack_00000010;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined1 in_stack_0000188e;
  undefined1 in_stack_0000188f;
  Header *in_stack_00001890;
  OutputStreamMutex *in_stack_fffffffffffffdc0;
  OStream *in_stack_fffffffffffffdc8;
  GenericOutputFile *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffde8;
  StdOFStream *in_stack_fffffffffffffdf0;
  TileOffsets *this_00;
  Data *in_stack_fffffffffffffe40;
  Header *in_stack_fffffffffffffe68;
  DeepTiledOutputFile *in_stack_fffffffffffffe70;
  
  GenericOutputFile::GenericOutputFile((GenericOutputFile *)in_RDI);
  in_RDI->_vptr_OStream = (_func_int **)&PTR__DeepTiledOutputFile_00562af0;
  this_00 = (TileOffsets *)&in_RDI->_fileName;
  pvVar1 = operator_new(0x1d0);
  Data::Data(in_stack_fffffffffffffe40,(int)((ulong)pvVar1 >> 0x20));
  *(void **)this_00 = pvVar1;
  pvVar1 = operator_new(0x38);
  OutputStreamMutex::OutputStreamMutex(in_stack_fffffffffffffdc0);
  *(void **)(*(long *)&in_RDI->_fileName + 0x1c0) = pvVar1;
  *(undefined1 *)(*(long *)&in_RDI->_fileName + 0x1c8) = 1;
  Header::sanityCheck(in_stack_00001890,(bool)in_stack_0000188f,(bool)in_stack_0000188e);
  pvVar1 = operator_new(0x38);
  StdOFStream::StdOFStream(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  *(void **)(*(long *)(*(long *)&in_RDI->_fileName + 0x1c0) + 0x28) = pvVar1;
  initialize(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  uVar2 = (**(code **)(**(long **)(*(long *)(*(long *)&in_RDI->_fileName + 0x1c0) + 0x28) + 0x18))()
  ;
  *(undefined8 *)(*(long *)(*(long *)&in_RDI->_fileName + 0x1c0) + 0x30) = uVar2;
  GenericOutputFile::writeMagicNumberAndVersionField
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(Header *)in_stack_fffffffffffffdc0
            );
  IVar3 = Header::writeTo(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  *(Int64 *)(*(long *)&in_RDI->_fileName + 0xb8) = IVar3;
  IVar3 = TileOffsets::writeTo(this_00,in_RDI);
  *(Int64 *)(*(long *)&in_RDI->_fileName + 0x150) = IVar3;
  *(undefined1 *)(*(long *)&in_RDI->_fileName + 0x3c) = 0;
  return;
}

Assistant:

DeepTiledOutputFile::DeepTiledOutputFile
    (const char fileName[],
     const Header &header,
     int numThreads)
:
    _data (new Data (numThreads))

{
    _data->_streamData=new OutputStreamMutex();
    _data->_deleteStream =true;
    try
    {
        header.sanityCheck (true);
        _data->_streamData->os = new StdOFStream (fileName);
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField(*_data->_streamData->os, _data->header);
        _data->previewPosition = _data->header.writeTo (*_data->_streamData->os, true);
        _data->tileOffsetsPosition = _data->tileOffsets.writeTo (*_data->_streamData->os);
	_data->multipart = false;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (_data && _data->_streamData && _data->_streamData->os) delete _data->_streamData->os;
        if (_data && _data->_streamData)     delete _data->_streamData;
        if (_data)           delete _data;

        REPLACE_EXC (e, "Cannot open image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (_data && _data->_streamData && _data->_streamData->os) delete _data->_streamData->os;
        if (_data->_streamData)     delete _data->_streamData;
        if (_data)           delete _data;

        throw;
    }
}